

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O2

bool spvtools::opt::blockmergeutil::anon_unknown_0::IsContinue(IRContext *context,uint32_t id)

{
  bool bVar1;
  DefUseManager *this;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this = IRContext::get_def_use_mgr(context);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp:55:11)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp:55:11)>
             ::_M_manager;
  bVar1 = analysis::DefUseManager::WhileEachUse
                    (this,id,(function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *)
                             &local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return !bVar1;
}

Assistant:

bool IsContinue(IRContext* context, uint32_t id) {
  return !context->get_def_use_mgr()->WhileEachUse(
      id, [](Instruction* user, uint32_t index) {
        spv::Op op = user->opcode();
        if (op == spv::Op::OpLoopMerge && index == 1u) {
          return false;
        }
        return true;
      });
}